

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O3

void ev_resume(ev_loop *loop)

{
  double dVar1;
  
  dVar1 = loop->mn_now;
  time_update(loop,1e+100);
  timers_reschedule(loop,loop->mn_now - dVar1);
  periodics_reschedule(loop);
  return;
}

Assistant:

void
ev_resume (EV_P) EV_THROW
{
  ev_tstamp mn_prev = mn_now;

  ev_now_update (EV_A);
  timers_reschedule (EV_A_ mn_now - mn_prev);
#if EV_PERIODIC_ENABLE
  /* TODO: really do this? */
  periodics_reschedule (EV_A);
#endif
}